

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

Bucket * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,size_t id)

{
  Bucket *__args;
  vector<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
  *in_RSI;
  Bucket *in_RDI;
  Bucket *bucket;
  
  __args = getNewBucket((RelationsGraph<dg::vr::ValueRelations> *)bucket);
  std::
  vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
  ::emplace_back<unsigned_long&,dg::vr::Bucket_const&>(in_RSI,&__args->id,in_RDI);
  return __args;
}

Assistant:

const Bucket &getBorderBucket(size_t id) {
        const Bucket &bucket = getNewBucket();
        assert(getBorderB(id) == nullptr);
        borderBuckets.emplace_back(id, bucket);
        return bucket;
    }